

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_panel.cpp
# Opt level: O2

Am_Value inter_value_from_panel_value_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Slot_Flags in_RSI;
  Am_Value AVar2;
  Am_Object panel;
  Am_Value panel_value;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  Am_Object::Get_Owner(&panel,in_RSI);
  bVar1 = Am_Object::Valid(&panel);
  if (bVar1) {
    panel_value.type = 0;
    panel_value.value.wrapper_value = (Am_Wrapper *)0x0;
    in_value = Am_Object::Get(&panel,0x169,1);
    Am_Value::operator=(&panel_value,in_value);
    get_inter_value_from_panel_value(&panel_value,&panel,(Am_Value *)self);
    Am_Value::~Am_Value(&panel_value);
  }
  Am_Object::~Am_Object(&panel);
  AVar2.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar2._0_8_ = self;
  return AVar2;
}

Assistant:

Am_Define_Formula(Am_Value, inter_value_from_panel_value)
{
  Am_Value value;
  Am_Object panel = self.Get_Owner();
  if (!panel.Valid()) {
    return value;
  }
  Am_Value panel_value;
  panel_value = panel.Peek(Am_VALUE);
  // std::cout << "** computing inter " << self << " value from panel value " <<
  //  panel_value <<std::endl <<std::flush;
  get_inter_value_from_panel_value(panel_value, panel, value);
  return value;
}